

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-ft-stroker.c
# Opt level: O0

PVG_FT_Error ft_stroker_arcto(PVG_FT_Stroker stroker,PVG_FT_Int side)

{
  PVG_FT_Fixed radius_00;
  PVG_FT_Error PVar1;
  long lVar2;
  PVG_FT_StrokeBorder border;
  PVG_FT_Error error;
  PVG_FT_Fixed radius;
  PVG_FT_Angle rotate;
  PVG_FT_Angle total;
  PVG_FT_Int side_local;
  PVG_FT_Stroker stroker_local;
  
  radius_00 = stroker->radius;
  lVar2 = (long)side * -0xb40000 + 0x5a0000;
  rotate = PVG_FT_Angle_Diff(stroker->angle_in,stroker->angle_out);
  if (rotate == 0xb40000) {
    rotate = lVar2 * -2;
  }
  PVar1 = ft_stroke_border_arcto
                    (stroker->borders + side,&stroker->center,radius_00,stroker->angle_in + lVar2,
                     rotate);
  stroker->borders[side].movable = '\0';
  return PVar1;
}

Assistant:

static PVG_FT_Error ft_stroker_arcto(PVG_FT_Stroker stroker, PVG_FT_Int side)
{
    PVG_FT_Angle        total, rotate;
    PVG_FT_Fixed        radius = stroker->radius;
    PVG_FT_Error        error = 0;
    PVG_FT_StrokeBorder border = stroker->borders + side;

    rotate = PVG_FT_SIDE_TO_ROTATE(side);

    total = PVG_FT_Angle_Diff(stroker->angle_in, stroker->angle_out);
    if (total == PVG_FT_ANGLE_PI) total = -rotate * 2;

    error = ft_stroke_border_arcto(border, &stroker->center, radius,
                                   stroker->angle_in + rotate, total);
    border->movable = FALSE;
    return error;
}